

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall
duckdb::DictionaryCompressionCompressState::CreateEmptySegment
          (DictionaryCompressionCompressState *this,idx_t row_start)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  optional_ptr<duckdb::FileBuffer,_true> *this_01;
  BlockManager *pBVar1;
  CompressionFunction *function;
  uint *puVar2;
  pointer puVar3;
  undefined8 uVar4;
  DatabaseInstance *pDVar5;
  LogicalType *type;
  idx_t iVar6;
  idx_t iVar7;
  BufferManager *pBVar8;
  pointer pCVar9;
  type pCVar10;
  iterator __position;
  undefined1 local_58 [40];
  
  local_58._8_8_ = row_start;
  pDVar5 = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar1 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
  function = this->function;
  iVar6 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar1->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_58,pDVar5,function,type,local_58._8_8_,iVar6 - iVar7,
             (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager);
  uVar4 = local_58._0_8_;
  this_00 = &this->current_segment;
  local_58._0_8_ = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             this_00,(pointer)uVar4);
  std::
  _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_int>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_int>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_int>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_int>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&this->current_string_map);
  puVar2 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current != puVar2) {
    (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
    __position._M_current = puVar2;
  }
  local_58._16_4_ = 0;
  if (__position._M_current ==
      (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               __position,(uint *)(local_58 + 0x10));
  }
  else {
    *__position._M_current = 0;
    (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  puVar3 = (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  this->current_width = '\0';
  this->next_width = '\0';
  pDVar5 = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  pBVar8 = BufferManager::GetBufferManager(pDVar5);
  pCVar9 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  (*pBVar8->_vptr_BufferManager[7])(local_58 + 0x10,pBVar8,&pCVar9->block);
  BufferHandle::operator=(&this->current_handle,(BufferHandle *)(local_58 + 0x10));
  BufferHandle::~BufferHandle((BufferHandle *)(local_58 + 0x10));
  pCVar10 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator*(this_00);
  this_01 = &(this->current_handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_01);
  this->current_dictionary =
       *(StringDictionaryContainer *)(((this->current_handle).node.ptr)->buffer + pCVar10->offset);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_01);
  uVar4 = local_58._0_8_;
  this->current_end_ptr = ((this->current_handle).node.ptr)->buffer + (this->current_dictionary).end
  ;
  if ((ColumnSegment *)local_58._0_8_ != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment((ColumnSegment *)local_58._0_8_);
    operator_delete((void *)uVar4);
  }
  return;
}

Assistant:

void DictionaryCompressionCompressState::CreateEmptySegment(idx_t row_start) {
	auto &db = checkpoint_data.GetDatabase();
	auto &type = checkpoint_data.GetType();

	auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
	                                                                info.GetBlockManager());
	current_segment = std::move(compressed_segment);

	// Reset the buffers and the string map.
	current_string_map.clear();
	index_buffer.clear();

	// Reserve index 0 for null strings.
	index_buffer.push_back(0);
	selection_buffer.clear();

	current_width = 0;
	next_width = 0;

	// Reset the pointers into the current segment.
	auto &buffer_manager = BufferManager::GetBufferManager(checkpoint_data.GetDatabase());
	current_handle = buffer_manager.Pin(current_segment->block);
	current_dictionary = DictionaryCompression::GetDictionary(*current_segment, current_handle);
	current_end_ptr = current_handle.Ptr() + current_dictionary.end;
}